

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O3

Vec_Int_t * Abc_NtkPrecomputeFirsts(Mio_Cell2_t *pCells,int nCells)

{
  Vec_Int_t *p;
  int *piVar1;
  long lVar2;
  int iVar3;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  piVar1 = (int *)malloc(0x40);
  p->pArray = piVar1;
  p->nSize = 2;
  if (piVar1 != (int *)0x0) {
    piVar1[0] = -1;
    piVar1[1] = -1;
  }
  iVar3 = 2;
  if (2 < nCells) {
    lVar2 = 0;
    iVar3 = 0;
    do {
      Vec_IntPush(p,iVar3);
      iVar3 = iVar3 + (*(uint *)((long)pCells[2].iDelays + lVar2 + -0x1c) >> 0x1c) * 3 + 3;
      lVar2 = lVar2 + 0x50;
    } while ((ulong)(uint)nCells * 0x50 + -0xa0 != lVar2);
    iVar3 = p->nSize;
  }
  if (iVar3 == nCells) {
    return p;
  }
  __assert_fail("nCells == Vec_IntSize(vFirst)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                ,0x84,"Vec_Int_t *Abc_NtkPrecomputeFirsts(Mio_Cell2_t *, int)");
}

Assistant:

Vec_Int_t * Abc_NtkPrecomputeFirsts( Mio_Cell2_t * pCells, int nCells )
{
    int i, Index = 0;
    Vec_Int_t * vFirst = Vec_IntStartFull( 2 ); 
    for ( i = 2; i < nCells; i++ )
    {
        Vec_IntPush( vFirst, Index );
        Index += 3 * (pCells[i].nFanins + 1);
    }
    assert( nCells == Vec_IntSize(vFirst) );
    return vFirst;
}